

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

bool duckdb::Date::IsValid(int32_t year,int32_t month,int32_t day)

{
  int iVar1;
  bool bVar2;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  bool local_11;
  bool local_1;
  
  if ((in_ESI < 1) || (0xc < in_ESI)) {
    local_1 = false;
  }
  else if (in_EDX < 1) {
    local_1 = false;
  }
  else {
    if (in_EDI < -0x59af88) {
      if (in_EDI < -0x59af89) {
        return false;
      }
      if ((in_EDI == -0x59af89) && ((in_ESI < 6 || ((in_ESI == 6 && (in_EDX < 0x19)))))) {
        return false;
      }
    }
    if (0x59beeb < in_EDI) {
      if (0x59beec < in_EDI) {
        return false;
      }
      if ((in_EDI == 0x59beec) && ((7 < in_ESI || ((in_ESI == 7 && (10 < in_EDX)))))) {
        return false;
      }
    }
    bVar2 = IsLeapYear(in_EDI);
    if (bVar2) {
      iVar1 = *(int *)(LEAP_DAYS + (long)in_ESI * 4);
    }
    else {
      iVar1 = *(int *)(NORMAL_DAYS + (long)in_ESI * 4);
    }
    local_11 = in_EDX <= iVar1;
    local_1 = local_11;
  }
  return local_1;
}

Assistant:

bool Date::IsValid(int32_t year, int32_t month, int32_t day) {
	if (month < 1 || month > 12) {
		return false;
	}
	if (day < 1) {
		return false;
	}
	if (year <= DATE_MIN_YEAR) {
		if (year < DATE_MIN_YEAR) {
			return false;
		} else if (year == DATE_MIN_YEAR) {
			if (month < DATE_MIN_MONTH || (month == DATE_MIN_MONTH && day < DATE_MIN_DAY)) {
				return false;
			}
		}
	}
	if (year >= DATE_MAX_YEAR) {
		if (year > DATE_MAX_YEAR) {
			return false;
		} else if (year == DATE_MAX_YEAR) {
			if (month > DATE_MAX_MONTH || (month == DATE_MAX_MONTH && day > DATE_MAX_DAY)) {
				return false;
			}
		}
	}
	return Date::IsLeapYear(year) ? day <= Date::LEAP_DAYS[month] : day <= Date::NORMAL_DAYS[month];
}